

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEngine::compositionModeChanged(QRasterPaintEngine *this)

{
  CompositionMode CVar1;
  QRasterPaintEnginePrivate *this_00;
  QRasterPaintEngineState *pQVar2;
  QRasterBuffer *pQVar3;
  QRasterPaintEngineState *s;
  QRasterPaintEnginePrivate *d;
  
  this_00 = d_func((QRasterPaintEngine *)0x562a6b);
  pQVar2 = state((QRasterPaintEngine *)0x562a79);
  pQVar2->fillFlags = pQVar2->fillFlags | 0x400;
  pQVar2->dirty = pQVar2->dirty | 0x400;
  pQVar2->strokeFlags = pQVar2->strokeFlags | 0x400;
  CVar1 = (pQVar2->super_QPainterState).composition_mode;
  pQVar3 = QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::operator->
                     (&this_00->rasterBuffer);
  pQVar3->compositionMode = CVar1;
  QRasterPaintEnginePrivate::recalculateFastImages(this_00);
  return;
}

Assistant:

void QRasterPaintEngine::compositionModeChanged()
{
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();

#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::compositionModeChanged()" << s->composition_mode;
#endif

    s->fillFlags |= DirtyCompositionMode;
    s->dirty |= DirtyCompositionMode;

    s->strokeFlags |= DirtyCompositionMode;
    d->rasterBuffer->compositionMode = s->composition_mode;

    d->recalculateFastImages();
}